

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O0

scalar_function_t *
duckdb::UDFWrapper::CreateScalarFunction<short,short>
          (string *name,vector<duckdb::LogicalType,_true> *args,LogicalType *ret_type,
          _func_short_short *udf_func)

{
  bool bVar1;
  runtime_error *prVar2;
  size_type sVar3;
  vector<duckdb::LogicalType,_true> *in_RCX;
  string *in_RDX;
  scalar_function_t *in_RDI;
  LogicalType *in_R8;
  size_t num_template_types;
  LogicalType *in_stack_ffffffffffffffc8;
  _func_short_short *in_stack_ffffffffffffffd0;
  
  bVar1 = TypesMatch<short>(in_stack_ffffffffffffffc8);
  if (!bVar1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,"Return type doesn\'t match with the first template type.");
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar3 = std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::size
                    ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)in_RDX);
  if (sVar3 != 1) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,
               "The number of templated types should be the same quantity of the LogicalType arguments."
              );
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  CreateUnaryFunction<short,short>(in_RDX,in_RCX,in_R8,in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

inline static scalar_function_t CreateScalarFunction(const string &name, const vector<LogicalType> &args,
	                                                     const LogicalType &ret_type, TR (*udf_func)(ARGS...)) {
		if (!TypesMatch<TR>(ret_type)) { // LCOV_EXCL_START
			throw std::runtime_error("Return type doesn't match with the first template type.");
		} // LCOV_EXCL_STOP

		const std::size_t num_template_types = sizeof...(ARGS);
		if (num_template_types != args.size()) { // LCOV_EXCL_START
			throw std::runtime_error(
			    "The number of templated types should be the same quantity of the LogicalType arguments.");
		} // LCOV_EXCL_STOP

		switch (num_template_types) {
		case 1:
			return CreateUnaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		case 2:
			return CreateBinaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		case 3:
			return CreateTernaryFunction<TR, ARGS...>(name, args, ret_type, udf_func);
		default: // LCOV_EXCL_START
			throw std::runtime_error("UDF function only supported until ternary!");
		} // LCOV_EXCL_STOP
	}